

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

void acutest_help_(void)

{
  printf("Usage: %s [options] [test...]\n",acutest_argv0_);
  putchar(10);
  puts("Run the specified unit tests; or if the option \'--exclude\' is used, run all");
  puts("tests in the suite but those listed.  By default, if no tests are specified");
  puts("on the command line, all unit tests in the suite are run.");
  putchar(10);
  puts("Options:");
  puts("  -X, --exclude         Execute all unit tests but the listed ones");
  puts("      --exec[=WHEN]     If supported, execute unit tests as child processes");
  puts("                          (WHEN is one of \'auto\', \'always\', \'never\')");
  puts("  -E, --no-exec         Same as --exec=never");
  puts("  -t, --time            Measure test duration (real time)");
  puts("      --time=TIMER      Measure test duration, using given timer");
  puts("                          (TIMER is one of \'real\', \'cpu\')");
  puts("      --no-summary      Suppress printing of test results summary");
  puts("      --tap             Produce TAP-compliant output");
  puts("                          (See https://testanything.org/)");
  puts("  -x, --xml-output=FILE Enable XUnit output to the given file");
  puts("  -l, --list            List unit tests in the suite and exit");
  puts("  -v, --verbose         Make output more verbose");
  puts("      --verbose=LEVEL   Set verbose level to LEVEL:");
  puts("                          0 ... Be silent");
  puts("                          1 ... Output one line per test (and summary)");
  puts("                          2 ... As 1 and failed conditions (this is default)");
  puts("                          3 ... As 1 and all conditions (and extended summary)");
  puts("  -q, --quiet           Same as --verbose=0");
  puts("      --color[=WHEN]    Enable colorized output");
  puts("                          (WHEN is one of \'auto\', \'always\', \'never\')");
  puts("      --no-color        Same as --color=never");
  puts("  -h, --help            Display this help and exit");
  if (acutest_list_size_ < 0x10) {
    putchar(10);
    acutest_list_names_();
    return;
  }
  return;
}

Assistant:

static void
acutest_help_(void)
{
    printf("Usage: %s [options] [test...]\n", acutest_argv0_);
    printf("\n");
    printf("Run the specified unit tests; or if the option '--exclude' is used, run all\n");
    printf("tests in the suite but those listed.  By default, if no tests are specified\n");
    printf("on the command line, all unit tests in the suite are run.\n");
    printf("\n");
    printf("Options:\n");
    printf("  -X, --exclude         Execute all unit tests but the listed ones\n");
    printf("      --exec[=WHEN]     If supported, execute unit tests as child processes\n");
    printf("                          (WHEN is one of 'auto', 'always', 'never')\n");
    printf("  -E, --no-exec         Same as --exec=never\n");
#if defined ACUTEST_WIN_
    printf("  -t, --time            Measure test duration\n");
#elif defined ACUTEST_HAS_POSIX_TIMER_
    printf("  -t, --time            Measure test duration (real time)\n");
    printf("      --time=TIMER      Measure test duration, using given timer\n");
    printf("                          (TIMER is one of 'real', 'cpu')\n");
#endif
    printf("      --no-summary      Suppress printing of test results summary\n");
    printf("      --tap             Produce TAP-compliant output\n");
    printf("                          (See https://testanything.org/)\n");
    printf("  -x, --xml-output=FILE Enable XUnit output to the given file\n");
    printf("  -l, --list            List unit tests in the suite and exit\n");
    printf("  -v, --verbose         Make output more verbose\n");
    printf("      --verbose=LEVEL   Set verbose level to LEVEL:\n");
    printf("                          0 ... Be silent\n");
    printf("                          1 ... Output one line per test (and summary)\n");
    printf("                          2 ... As 1 and failed conditions (this is default)\n");
    printf("                          3 ... As 1 and all conditions (and extended summary)\n");
    printf("  -q, --quiet           Same as --verbose=0\n");
    printf("      --color[=WHEN]    Enable colorized output\n");
    printf("                          (WHEN is one of 'auto', 'always', 'never')\n");
    printf("      --no-color        Same as --color=never\n");
    printf("  -h, --help            Display this help and exit\n");

    if(acutest_list_size_ < 16) {
        printf("\n");
        acutest_list_names_();
    }
}